

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O1

void __thiscall Result::Result(Result *this,Individual *individual)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer piVar2;
  pointer piVar3;
  pointer pCVar4;
  element_type *peVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Individual::getUsedInstance(individual);
  p_Var1 = (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_30;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  Resize(this,((this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->numProcessors);
  pvVar7 = Individual::getCoresAsignedToTasks(individual);
  piVar2 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 != piVar3) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      uVar9 = (ulong)piVar2[uVar12];
      pCVar4 = (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = uVar9;
      if (((ulong)((long)(this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar4 >> 5) <= uVar9) ||
         (peVar5 = (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,
         lVar6 = (long)(peVar5->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                       super__Vector_impl_data._M_start, uVar10 = uVar12,
         (ulong)((long)(peVar5->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                       super__Vector_impl_data._M_finish - lVar6 >> 3) <= uVar12)) {
        uVar8 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar10);
        p_Var1 = (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        std::vector<Core,_std::allocator<Core>_>::~vector(&this->Cores);
        _Unwind_Resume(uVar8);
      }
      Core::addtask(pCVar4 + uVar9,*(Task *)(lVar6 + uVar12 * 8));
      uVar12 = uVar12 + 1;
      lVar6 = lVar11 + 4;
      lVar11 = lVar11 + 4;
    } while ((pointer)((long)piVar2 + lVar6) != piVar3);
  }
  calcmax(this);
  return;
}

Assistant:

Result::Result(Individual individual){
	usedInstance = individual.getUsedInstance();
	Resize(usedInstance->getNumProcessors());

	int taskId = 0;
	for(auto& coreId : individual.getCoresAsignedToTasks()){
		Cores.at(coreId).addtask( usedInstance->getNthTask(taskId) );
		taskId++;
	}

	calcmax();
}